

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_CreateString(char *string)

{
  cJSON *item;
  size_t sVar1;
  char *__dest;
  
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x10;
    if (string != (char *)0x0) {
      sVar1 = strlen(string);
      __dest = (char *)(*global_hooks.allocate)(sVar1 + 1);
      if (__dest != (char *)0x0) {
        memcpy(__dest,string,sVar1 + 1);
        item->valuestring = __dest;
        return item;
      }
    }
    item->valuestring = (char *)0x0;
    cJSON_Delete(item);
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateString(const char *string)
{
    cJSON *item = cJSON_New_Item(&global_hooks);
    if(item)
    {
        item->type = cJSON_String;
        item->valuestring = (char*)cJSON_strdup((const unsigned char*)string, &global_hooks);
        if(!item->valuestring)
        {
            cJSON_Delete(item);
            return NULL;
        }
    }

    return item;
}